

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignEvaluator.h
# Opt level: O0

void Eigen::internal::
     dense_assignment_loop<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>_>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>,_-1,_1,_false>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>,_3,_0>
     ::run(generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>,__1,_1,_false>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
           *kernel)

{
  Index size_00;
  Scalar *array;
  long start;
  undefined8 local_30;
  Index index;
  Index alignedEnd;
  Index alignedStart;
  Index size;
  generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,__1,__1,_1,__1,__1>,_1,__1,_true>,_1,__1,_false>_>,__1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_const_Eigen::Block<const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,__1,_1,_1,__1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,__1,_8,_0,__1,_8>,__1,__1,_false>,__1,_1,_true>,__1,_1,_false>_>_>_>,__1,_1,_false>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
  *kernel_local;
  
  size_00 = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>_>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>,_-1,_1,_false>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
            ::size(kernel);
  array = generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_-1,_-1,_1,_-1,_-1>,_1,_-1,_true>,_1,_-1,_false>_>,_-1,_1,_false>_>,_Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_const_Eigen::Block<const_Eigen::Transpose<const_Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,_float>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,_const_Eigen::Matrix<float,_1,_-1,_1,_1,_-1>_>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Block<Eigen::Matrix<float,_-1,_8,_0,_-1,_8>,_-1,_-1,_false>,_-1,_1,_true>,_-1,_1,_false>_>_>_>,_-1,_1,_false>_>_>,_Eigen::internal::sub_assign_op<float,_float>,_0>
          ::dstDataPtr(kernel);
  local_30 = first_aligned<16,float,long>(array,size_00);
  start = local_30 + ((size_00 - local_30) / 4) * 4;
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>,_1,1,false>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const,_1,1,true>const,_1,1,false>const>const>const>const,_1,1,false>const>>,Eigen::internal::sub_assign_op<float,float>,0>>
            (kernel,0,local_30);
  for (; local_30 < start; local_30 = local_30 + 4) {
    generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,-1,1,-1,-1>,1,-1,true>,1,-1,false>>,-1,1,false>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,-1,1,0,-1,1>const>const,Eigen::Block<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,-1,1,1,-1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,-1,8,0,-1,8>,-1,-1,false>const,-1,1,true>const,-1,1,false>const>const>const>const,-1,1,false>const>>,Eigen::internal::sub_assign_op<float,float>,0>
    ::assignPacket<16,0,float__vector(4)>
              ((generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>,_1,1,false>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const,_1,1,true>const,_1,1,false>const>const>const>const,_1,1,false>const>>,Eigen::internal::sub_assign_op<float,float>,0>
                *)kernel,local_30);
  }
  unaligned_dense_assignment_loop<false>::
  run<Eigen::internal::generic_dense_assignment_kernel<Eigen::internal::evaluator<Eigen::Block<Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,_1,1,_1,_1>,1,_1,true>,1,_1,false>>,_1,1,false>>,Eigen::internal::evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,_1,1,0,_1,1>const>const,Eigen::Block<Eigen::Transpose<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<float,float>,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<float>,Eigen::Matrix<float,1,_1,1,1,_1>const>const,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<float,_1,8,0,_1,8>,_1,_1,false>const,_1,1,true>const,_1,1,false>const>const>const>const,_1,1,false>const>>,Eigen::internal::sub_assign_op<float,float>,0>>
            (kernel,start,size_00);
  return;
}

Assistant:

void run(Kernel &kernel)
  {
    const Index size = kernel.size();
    typedef typename Kernel::Scalar Scalar;
    typedef typename Kernel::PacketType PacketType;
    enum {
      requestedAlignment = Kernel::AssignmentTraits::LinearRequiredAlignment,
      packetSize = unpacket_traits<PacketType>::size,
      dstIsAligned = int(Kernel::AssignmentTraits::DstAlignment)>=int(requestedAlignment),
      dstAlignment = packet_traits<Scalar>::AlignedOnScalar ? int(requestedAlignment)
                                                            : int(Kernel::AssignmentTraits::DstAlignment),
      srcAlignment = Kernel::AssignmentTraits::JointAlignment
    };
    const Index alignedStart = dstIsAligned ? 0 : internal::first_aligned<requestedAlignment>(kernel.dstDataPtr(), size);
    const Index alignedEnd = alignedStart + ((size-alignedStart)/packetSize)*packetSize;

    unaligned_dense_assignment_loop<dstIsAligned!=0>::run(kernel, 0, alignedStart);

    for(Index index = alignedStart; index < alignedEnd; index += packetSize)
      kernel.template assignPacket<dstAlignment, srcAlignment, PacketType>(index);

    unaligned_dense_assignment_loop<>::run(kernel, alignedEnd, size);
  }